

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  string *lhs;
  bool bVar1;
  int iVar2;
  long lVar3;
  unsigned_long dyndep;
  
  lhs = &this->NinjaVersion;
  RequiredNinjaVersionForConsolePool_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsConsolePool = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForImplicitOuts_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsImplicitOuts = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForManifestRestat_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsManifestRestat = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForMultilineDepfile_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsMultilineDepfile = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForDyndepsCxx_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsDyndepsCxx = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForDyndepsFortran_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsDyndepsFortran = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  if (this->NinjaSupportsDyndepsFortran == false) {
    if (CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-",
                   (allocator<char> *)&dyndep);
        __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
      }
    }
    lVar3 = std::__cxx11::string::find((string *)lhs,0x9b92d8);
    if (lVar3 != -1) {
      dyndep = 0;
      cmStrToULong((lhs->_M_dataplus)._M_p +
                   CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_string_length + lVar3,&dyndep);
      if (dyndep == 1) {
        this->NinjaSupportsDyndepsFortran = true;
      }
    }
  }
  RequiredNinjaVersionForUnconditionalRecompactTool_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsUnconditionalRecompactTool = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForRestatTool_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsRestatTool = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForMultipleOutputs_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsMultipleOutputs = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForMetadataOnRegeneration_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsMetadataOnRegeneration = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  RequiredNinjaVersionForCWDDepend_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,(string *)&dyndep);
  this->NinjaSupportsCWDDepend = !bVar1;
  std::__cxx11::string::~string((string *)&dyndep);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForConsolePool());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion,
    cmGlobalNinjaGenerator::RequiredNinjaVersionForImplicitOuts());
  this->NinjaSupportsManifestRestat =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForManifestRestat());
  this->NinjaSupportsMultilineDepfile =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForMultilineDepfile());
  this->NinjaSupportsDyndepsCxx =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForDyndepsCxx());
  this->NinjaSupportsDyndepsFortran =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForDyndepsFortran());
  if (!this->NinjaSupportsDyndepsFortran) {
    // The ninja version number is not new enough to have upstream support.
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = &this->NinjaVersion[pos + k_DYNDEP_.size()];
      unsigned long dyndep = 0;
      cmStrToULong(fv, &dyndep);
      if (dyndep == 1) {
        this->NinjaSupportsDyndepsFortran = true;
      }
    }
  }
  this->NinjaSupportsUnconditionalRecompactTool =
    !cmSystemTools::VersionCompare(
      cmSystemTools::OP_LESS, this->NinjaVersion,
      RequiredNinjaVersionForUnconditionalRecompactTool());
  this->NinjaSupportsRestatTool =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForRestatTool());
  this->NinjaSupportsMultipleOutputs =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForMultipleOutputs());
  this->NinjaSupportsMetadataOnRegeneration = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion,
    RequiredNinjaVersionForMetadataOnRegeneration());
#ifdef _WIN32
  this->NinjaSupportsCodePage =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForCodePage());
  if (this->NinjaSupportsCodePage) {
    this->CheckNinjaCodePage();
  } else {
    this->NinjaExpectedEncoding = codecvt_Encoding::ANSI;
  }
#endif
  this->NinjaSupportsCWDDepend =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForCWDDepend());
}